

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tent_dist.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,param_type *P)

{
  long lVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  _Setprecision _Var3;
  ostream *poVar4;
  char *pcVar5;
  int extraout_EDX;
  param_type *in_RSI;
  void *pvVar6;
  ostream *in_RDI;
  int in_R8D;
  int in_R9D;
  float extraout_XMM0_Da;
  result_type_conflict1 rVar7;
  fmtflags flags;
  
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  pcVar5 = *(char **)in_RDI;
  lVar1 = *(long *)(pcVar5 + -0x18);
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)(in_RDI + lVar1),_Var2);
  poVar4 = std::operator<<(in_RDI,'(');
  _Var3 = Catch::clara::std::setprecision(7);
  pvVar6 = (void *)(ulong)(uint)_Var3._M_n;
  poVar4 = std::operator<<(poVar4,_Var3);
  tent_dist<float>::param_type::m(in_RSI,pvVar6,extraout_EDX,pcVar5,in_R8D,in_R9D);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,extraout_XMM0_Da);
  poVar4 = std::operator<<(poVar4,' ');
  rVar7 = tent_dist<float>::param_type::d(in_RSI);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar7);
  std::operator<<(poVar4,')');
  Catch::clara::std::ios_base::flags
            ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)),__fmtfl);
  return (basic_ostream<char,_std::char_traits<char>_> *)in_RDI;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
          std::basic_ostream<char_t, traits_t> &out, const param_type &P) {
        std::ios_base::fmtflags flags(out.flags());
        out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        out << '(' << std::setprecision(math::numeric_limits<float_t>::digits10 + 1) << P.m()
            << ' ' << P.d() << ')';
        out.flags(flags);
        return out;
      }